

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  bool bVar1;
  undefined8 in_RDI;
  ostringstream oss;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  undefined8 uVar2;
  string local_1e0 [32];
  string local_1c0 [48];
  ostringstream local_190 [384];
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_10 [2];
  
  uVar2 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"{ ");
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (bVar1) {
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::operator*
              (local_10);
    Catch::toString_abi_cxx11_((char)((ulong)uVar2 >> 0x38));
    std::operator<<((ostream *)local_190,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(local_10);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8), bVar1) {
      in_stack_fffffffffffffe00 = std::operator<<((ostream *)local_190,", ");
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator*(local_10);
      Catch::toString_abi_cxx11_((char)((ulong)uVar2 >> 0x38));
      std::operator<<(in_stack_fffffffffffffe00,local_1e0);
      std::__cxx11::string::~string(local_1e0);
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(local_10);
    }
  }
  std::operator<<((ostream *)local_190," }");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string rangeToString( InputIterator first, InputIterator last ) {
        std::ostringstream oss;
        oss << "{ ";
        if( first != last ) {
            oss << Catch::toString( *first );
            for( ++first ; first != last ; ++first )
                oss << ", " << Catch::toString( *first );
        }
        oss << " }";
        return oss.str();
    }